

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

error_info *
toml::detail::make_syntax_error<toml::detail::repeat_at_least>
          (error_info *__return_storage_ptr__,string *title,repeat_at_least *scanner,location *loc,
          string *suffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var3;
  size_type *psVar4;
  size_type sVar5;
  error_info *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  source_location src;
  size_type *local_218;
  size_type local_208;
  size_t sStack_200;
  string *local_1f8;
  error_info *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  size_type *local_1c8;
  size_type local_1c0;
  ulong local_1b8;
  size_t sStack_1b0;
  size_type *local_1a8;
  size_type local_1a0;
  size_type local_198;
  size_t sStack_190;
  undefined1 local_188 [104];
  undefined1 local_120 [48];
  size_t local_f0;
  size_t sStack_e8;
  _Alloc_hider local_e0;
  size_t local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  pointer local_c0;
  pointer pbStack_b8;
  pointer local_b0;
  undefined1 local_a8 [32];
  size_type local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  _Alloc_hider local_68;
  size_t local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_188._0_8_ = local_188 + 0x10;
  local_1f8 = suffix;
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"expected ","");
  if (scanner->length_ != 0) {
    bVar9 = true;
    uVar8 = 0;
    do {
      _Var3._M_head_impl =
           (scanner->other_).scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var3._M_head_impl)->_vptr_scanner_base[2])((region *)local_120,_Var3._M_head_impl,loc);
      if ((element_type *)local_120._0_8_ == (element_type *)0x0) {
        _Var3._M_head_impl =
             (scanner->other_).scanner_._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
        (*(_Var3._M_head_impl)->_vptr_scanner_base[4])(&local_1e8,_Var3._M_head_impl,loc);
        region::~region((region *)local_120);
        if (bVar9) goto LAB_0036f19a;
        break;
      }
      region::~region((region *)local_120);
      uVar8 = uVar8 + 1;
      bVar9 = uVar8 < scanner->length_;
    } while (bVar9);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
LAB_0036f19a:
  uVar8 = (long)(_func_int ***)local_188._8_8_ + local_1e8._M_string_length;
  uVar7 = 0xf;
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    uVar7 = local_188._16_8_;
  }
  if (uVar7 < uVar8) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar7 = CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                       local_1e8.field_2._M_local_buf[0]);
    }
    if (uVar8 <= uVar7) {
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_1e8,0,0,(char *)local_188._0_8_,local_188._8_8_);
      goto LAB_0036f20e;
    }
  }
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
LAB_0036f20e:
  __return_storage_ptr___00 = local_1f0;
  local_218 = &local_208;
  psVar4 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4 == paVar1) {
    local_208 = paVar1->_M_allocated_capacity;
    sStack_200 = *(size_t *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_208 = paVar1->_M_allocated_capacity;
    local_218 = psVar4;
  }
  sVar5 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  region::region((region *)local_188,loc);
  source_location::source_location((source_location *)local_120,(region *)local_188);
  region::~region((region *)local_188);
  local_1a8 = (size_type *)(title->_M_dataplus)._M_p;
  paVar2 = &title->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8 == paVar2) {
    local_198 = paVar2->_M_allocated_capacity;
    sStack_190 = *(size_t *)((long)&title->field_2 + 8);
    local_1a8 = &local_198;
  }
  else {
    local_198 = paVar2->_M_allocated_capacity;
  }
  local_1a0 = title->_M_string_length;
  (title->_M_dataplus)._M_p = (pointer)paVar2;
  title->_M_string_length = 0;
  (title->field_2)._M_local_buf[0] = '\0';
  local_68._M_p = (pointer)&local_58;
  local_78 = local_f0;
  sStack_70 = sStack_e8;
  local_88 = local_120._32_8_;
  sStack_80 = local_120._40_8_;
  local_a8._16_8_ = local_120._16_8_;
  local_a8._24_8_ = local_120._24_8_;
  local_a8._0_8_ = local_120._0_8_;
  local_a8._8_8_ = local_120._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p == &local_d0) {
    local_58._8_8_ = local_d0._8_8_;
  }
  else {
    local_68._M_p = local_e0._M_p;
  }
  local_60 = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_48 = local_c0;
  pbStack_40 = pbStack_b8;
  local_38 = local_b0;
  local_c0 = (pointer)0x0;
  pbStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  if (local_218 == &local_208) {
    sStack_1b0 = sStack_200;
    local_1c8 = &local_1b8;
  }
  else {
    local_1c8 = local_218;
  }
  local_1b8 = local_208;
  local_208 = local_208 & 0xffffffffffffff00;
  local_1c0 = sVar5;
  local_e0._M_p = (pointer)&local_d0;
  make_error_info<std::__cxx11::string>
            (__return_storage_ptr___00,(toml *)&local_1a8,(string *)local_a8,
             (source_location *)&local_1c8,local_1f8,in_R9);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  source_location::~source_location((source_location *)local_a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  source_location::~source_location((source_location *)local_120);
  return __return_storage_ptr___00;
}

Assistant:

error_info make_syntax_error(std::string title,
        const S& scanner, location loc, std::string suffix = "")
{
    auto msg = std::string("expected ") + scanner.expected_chars(loc);
    auto src = source_location(region(loc));
    return make_error_info(
        std::move(title), std::move(src), std::move(msg), std::move(suffix));
}